

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O3

MPP_RET vp8d_parser_parse(void *ctx,HalDecTask *in_task)

{
  vpBoolCoder_t *pvVar1;
  RK_S8 *pRVar2;
  RK_U8 (*paRVar3) [19];
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined2 uVar11;
  VP8DParserContext_t *p;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  vp8EntropyProbs_t *pvVar18;
  RK_U8 (*paRVar19) [19];
  RK_S8 RVar20;
  RK_U8 RVar21;
  uint uVar22;
  RK_U32 RVar23;
  vpColorSpace_e vVar24;
  RK_S32 RVar25;
  RK_U32 RVar26;
  int iVar27;
  MPP_RET MVar28;
  char *pcVar29;
  VP8Frame *pVVar30;
  FILE *__s;
  byte bVar31;
  bool bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  RK_U32 RVar39;
  long lVar40;
  uint3 *puVar41;
  ulong uVar42;
  MppFrame s;
  ulong uVar43;
  undefined8 uVar44;
  byte *pbVar45;
  DXVA_PicParams_VP8 *pDVar46;
  undefined4 *puVar47;
  RK_U8 *pRVar48;
  uint uVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  char name [256];
  char local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined4 local_130;
  undefined5 uVar6;
  undefined4 uVar8;
  undefined3 uVar10;
  
  p = *ctx;
  if ((vp8d_debug & 1) == 0) {
    pbVar45 = p->bitstream_sw_buf;
    RVar39 = p->stream_size;
  }
  else {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x508,
               "vp8d_parser_parse");
    pbVar45 = p->bitstream_sw_buf;
    RVar39 = p->stream_size;
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x4a3,
                 "decoder_frame_header");
    }
  }
  bVar33 = *pbVar45;
  uVar22 = bVar33 & 1;
  p->keyFrame = uVar22 ^ 1;
  bVar31 = *pbVar45 >> 1 & 7;
  p->vpVersion = bVar31;
  p->showFrame = 1;
  if ((bVar33 & 1) == 0) {
    if (p->needKeyFrame == 0) {
      p->needKeyFrame = 1;
    }
LAB_001af51e:
    RVar23 = p->decMode;
    if (RVar23 == 1) {
      p->offsetToDctParts = (uint)pbVar45[2] << 0xc | (uint)pbVar45[1] << 4 | (uint)(*pbVar45 >> 4);
      uVar49 = (bVar31 == 0) + 3;
    }
    else {
      p->offsetToDctParts = (uint)pbVar45[2] << 0xb | (uint)(*pbVar45 >> 5) + (uint)pbVar45[1] * 8;
      p->showFrame = *pbVar45 >> 4 & 1;
      uVar49 = 3;
    }
    p->frameTagSize = uVar49;
    if ((char)uVar22 == '\0') {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x2f1,
                   "vp8hwdResetProbs");
        RVar23 = p->decMode;
      }
      p->vp7ScanOrder[0xc] = 7;
      p->vp7ScanOrder[0xd] = 0xb;
      p->vp7ScanOrder[0xe] = 0xe;
      p->vp7ScanOrder[0xf] = 0xf;
      p->vp7ScanOrder[8] = 9;
      p->vp7ScanOrder[9] = 0xc;
      p->vp7ScanOrder[10] = 0xd;
      p->vp7ScanOrder[0xb] = 10;
      p->vp7ScanOrder[4] = 5;
      p->vp7ScanOrder[5] = 2;
      p->vp7ScanOrder[6] = 3;
      p->vp7ScanOrder[7] = 6;
      p->vp7ScanOrder[0] = 0;
      p->vp7ScanOrder[1] = 1;
      p->vp7ScanOrder[2] = 4;
      p->vp7ScanOrder[3] = 8;
      (p->entropy).probLuma16x16PredMode[0] = 'p';
      (p->entropy).probLuma16x16PredMode[1] = 'V';
      (p->entropy).probLuma16x16PredMode[2] = 0x8c;
      (p->entropy).probLuma16x16PredMode[3] = '%';
      (p->entropy).probChromaPredMode[0] = 0xa2;
      (p->entropy).probChromaPredMode[1] = 'e';
      (p->entropy).probChromaPredMode[2] = 0xcc;
      p->mbRefLfDelta[0] = 0;
      p->mbRefLfDelta[1] = 0;
      p->mbRefLfDelta[2] = 0;
      p->mbRefLfDelta[3] = 0;
      p->mbModeLfDelta[0] = 0;
      p->mbModeLfDelta[1] = 0;
      p->mbModeLfDelta[2] = 0;
      p->mbModeLfDelta[3] = 0;
      paRVar3 = (p->entropy).probMvContext;
      if (RVar23 == 2) {
        *(undefined8 *)((p->entropy).probMvContext[0] + 0x10) = 0x77aacc80a4fefeef;
        paRVar19 = (p->entropy).probMvContext;
        *(RK_U8 *)((long)(paRVar19 + 1) + 5) = 0xeb;
        *(RK_U8 *)((long)(paRVar19 + 1) + 6) = 0x8c;
        *(RK_U8 *)((long)(paRVar19 + 1) + 7) = 0xe6;
        *(RK_U8 *)((long)(paRVar19 + 1) + 8) = 0xe4;
        *(RK_U8 *)((long)(paRVar19 + 1) + 9) = 0x80;
        *(RK_U8 *)((long)(paRVar19 + 1) + 10) = 0x82;
        *(RK_U8 *)((long)(paRVar19 + 1) + 0xb) = 0x82;
        *(RK_U8 *)((long)(paRVar19 + 1) + 0xc) = 'J';
        *(RK_U8 *)((long)paRVar3 + 0) = 0xa2;
        *(RK_U8 *)((long)paRVar3 + 1) = 0x80;
        *(RK_U8 *)((long)paRVar3 + 2) = 0xe1;
        *(RK_U8 *)((long)paRVar3 + 3) = 0x92;
        *(RK_U8 *)((long)paRVar3 + 4) = 0xac;
        *(RK_U8 *)((long)paRVar3 + 5) = 0x93;
        *(RK_U8 *)((long)paRVar3 + 6) = 0xd6;
        *(RK_U8 *)((long)paRVar3 + 7) = '\'';
        pvVar18 = &p->entropy;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 8) = 0x9c;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 9) = 0x80;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 10) = 0x81;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xb) = 0x84;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xc) = 'K';
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xd) = 0x91;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xe) = 0xb2;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xf) = 0xce;
        paRVar3 = (p->entropy).probMvContext;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xb) = 0x82;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xc) = 'J';
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xd) = 0x94;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xe) = 0xb4;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xf) = 0xcb;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0x10) = 0xec;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0x11) = 0xfe;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0x12) = 0xfe;
      }
      else {
        *(RK_U8 *)((long)paRVar3 + 0) = 0xa2;
        *(RK_U8 *)((long)paRVar3 + 1) = 0x80;
        *(RK_U8 *)((long)paRVar3 + 2) = 0xe1;
        *(RK_U8 *)((long)paRVar3 + 3) = 0x92;
        *(RK_U8 *)((long)paRVar3 + 4) = 0xac;
        *(RK_U8 *)((long)paRVar3 + 5) = 0x93;
        *(RK_U8 *)((long)paRVar3 + 6) = 0xd6;
        *(RK_U8 *)((long)paRVar3 + 7) = '\'';
        pvVar18 = &p->entropy;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 8) = 0x9c;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 9) = 0xf7;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 10) = 0xd2;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xb) = 0x87;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xc) = 'D';
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xd) = 0x8a;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xe) = 0xdc;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 0) + 0xf) = 0xef;
        (p->entropy).probMvContext[0][0x10] = 0xf6;
        pvVar18 = &p->entropy;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 0) = 0xa4;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 1) = 0x80;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 2) = 0xcc;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 3) = 0xaa;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 4) = 'w';
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 5) = 0xeb;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 6) = 0x8c;
        *(RK_U8 *)((long)(pvVar18->probMvContext + 1) + 7) = 0xe6;
        paRVar3 = (p->entropy).probMvContext;
        *(RK_U8 *)((long)(paRVar3 + 1) + 8) = 0xe4;
        *(RK_U8 *)((long)(paRVar3 + 1) + 9) = 0xf4;
        *(RK_U8 *)((long)(paRVar3 + 1) + 10) = 0xb8;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xb) = 0xc9;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xc) = ',';
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xd) = 0xad;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xe) = 0xdd;
        *(RK_U8 *)((long)(paRVar3 + 1) + 0xf) = 0xef;
        (p->entropy).probMvContext[1][0x10] = 0xfd;
      }
      memcpy((p->entropy).probCoeffs,DefaultCoeffProbs,0x420);
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x319,
                   "vp8hwdResetProbs");
        RVar23 = p->decMode;
      }
    }
    pbVar45 = pbVar45 + uVar49;
    RVar39 = RVar39 - uVar49;
    if (RVar23 != 2) {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x3f4,
                   "vp7_header_parser");
      }
      pvVar1 = &p->bitstr;
      vp8hwdBoolStart(pvVar1,pbVar45,RVar39);
      if (p->keyFrame != 0) {
        RVar39 = vp8hwdReadBits(pvVar1,0xc);
        p->width = RVar39;
        RVar39 = vp8hwdReadBits(pvVar1,0xc);
        p->height = RVar39;
        RVar39 = vp8hwdReadBits(pvVar1,2);
        RVar39 = ScaleDimension(p->width,RVar39);
        p->scaledWidth = RVar39;
        RVar39 = vp8hwdReadBits(pvVar1,2);
        RVar39 = ScaleDimension(p->height,RVar39);
        p->scaledHeight = RVar39;
      }
      puVar47 = (undefined4 *)&DAT_00289070;
      if (p->vpVersion == '\0') {
        puVar47 = &DAT_00289060;
      }
      lVar38 = 0;
LAB_001afa50:
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      if (RVar39 == 0) goto code_r0x001afa5c;
      vp8hwdReadBits(pvVar1,8);
      iVar37 = 3;
      do {
        RVar39 = vp8hwdDecodeBool128(pvVar1);
        if (RVar39 != 0) {
          vp8hwdReadBits(pvVar1,8);
        }
        iVar37 = iVar37 + -1;
      } while (iVar37 != 0);
      RVar25 = puVar47[lVar38];
      if (RVar25 != 0) {
        iVar37 = 4;
        do {
          RVar39 = vp8hwdDecodeBool128(pvVar1);
          if (RVar39 != 0) {
            vp8hwdReadBits(pvVar1,RVar25);
          }
          iVar37 = iVar37 + -1;
        } while (iVar37 != 0);
      }
      uVar43 = 0x415;
      MVar28 = MPP_ERR_PROTOL;
      goto LAB_001aff46;
    }
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x337,
                 "vp8_header_parser");
    }
    if (p->keyFrame != 0) {
      MVar28 = MPP_ERR_PROTOL;
      if (((uint)pbVar45[2] | (uint)pbVar45[1] << 8 | (uint)*pbVar45 << 0x10) != 0x9d012a)
      goto LAB_001b0438;
      bVar33 = pbVar45[4];
      uVar22 = (bVar33 & 0x3f) << 8 | (uint)pbVar45[3];
      p->width = uVar22;
      RVar23 = ScaleDimension(uVar22,(uint)(bVar33 >> 6));
      p->scaledWidth = RVar23;
      bVar33 = pbVar45[6];
      uVar22 = (bVar33 & 0x3f) << 8 | (uint)pbVar45[5];
      p->height = uVar22;
      RVar23 = ScaleDimension(uVar22,(uint)(bVar33 >> 6));
      p->scaledHeight = RVar23;
      pbVar45 = pbVar45 + 7;
      RVar39 = RVar39 - 7;
    }
    pvVar1 = &p->bitstr;
    vp8hwdBoolStart(pvVar1,pbVar45,RVar39);
    if (p->keyFrame != 0) {
      vVar24 = vp8hwdDecodeBool128(pvVar1);
      p->colorSpace = vVar24;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->clamping = RVar39;
    }
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->segmentationEnabled = RVar39;
    p->segmentationMapUpdate = 0;
    if (RVar39 != 0) {
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->segmentationMapUpdate = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      if (RVar39 != 0) {
        RVar39 = vp8hwdDecodeBool128(pvVar1);
        p->segmentFeatureMode = RVar39;
        p->segmentQp[0] = 0;
        p->segmentQp[1] = 0;
        p->segmentQp[2] = 0;
        p->segmentQp[3] = 0;
        p->segmentLoopfilter[0] = 0;
        p->segmentLoopfilter[1] = 0;
        p->segmentLoopfilter[2] = 0;
        p->segmentLoopfilter[3] = 0;
        lVar38 = 0;
        do {
          RVar39 = vp8hwdDecodeBool128(pvVar1);
          if (RVar39 != 0) {
            RVar39 = vp8hwdReadBits(pvVar1,7);
            p->segmentQp[lVar38] = RVar39;
            RVar39 = vp8hwdDecodeBool128(pvVar1);
            if (RVar39 != 0) {
              p->segmentQp[lVar38] = -p->segmentQp[lVar38];
            }
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != 4);
        lVar38 = 0;
        do {
          RVar39 = vp8hwdDecodeBool128(pvVar1);
          if (RVar39 != 0) {
            RVar39 = vp8hwdReadBits(pvVar1,6);
            p->segmentLoopfilter[lVar38] = RVar39;
            RVar39 = vp8hwdDecodeBool128(pvVar1);
            if (RVar39 != 0) {
              p->segmentLoopfilter[lVar38] = -p->segmentLoopfilter[lVar38];
            }
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != 4);
      }
      if (p->segmentationMapUpdate != 0) {
        p->probSegment[0] = 0xff;
        p->probSegment[1] = 0xff;
        p->probSegment[2] = 0xff;
        lVar38 = 0;
        do {
          RVar39 = vp8hwdDecodeBool128(pvVar1);
          if (RVar39 != 0) {
            RVar39 = vp8hwdReadBits(pvVar1,8);
            p->probSegment[lVar38] = RVar39;
          }
          lVar38 = lVar38 + 1;
        } while (lVar38 != 3);
      }
      if ((p->bitstr).strmError == 0) goto LAB_001afb15;
      _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
      uVar43 = 0x36e;
LAB_001b03f6:
      MVar28 = MPP_ERR_STREAM;
      if ((vp8d_debug & 1) == 0) goto LAB_001b0438;
LAB_001b0405:
      pcVar29 = "vp8_header_parser";
      goto LAB_001b040c;
    }
LAB_001afb15:
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->loopFilterType = RVar39;
    RVar39 = vp8hwdReadBits(pvVar1,6);
    p->loopFilterLevel = RVar39;
    RVar39 = vp8hwdReadBits(pvVar1,3);
    p->loopFilterSharpness = RVar39;
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->modeRefLfEnabled = RVar39;
    if ((RVar39 != 0) && (RVar39 = vp8hwdDecodeBool128(pvVar1), RVar39 != 0)) {
      lVar38 = 0;
      do {
        RVar39 = vp8hwdDecodeBool128(pvVar1);
        if (RVar39 != 0) {
          RVar39 = vp8hwdReadBits(pvVar1,6);
          p->mbRefLfDelta[lVar38] = RVar39;
          RVar39 = vp8hwdDecodeBool128(pvVar1);
          if (RVar39 != 0) {
            p->mbRefLfDelta[lVar38] = -p->mbRefLfDelta[lVar38];
          }
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 != 4);
      lVar38 = 0;
      do {
        RVar39 = vp8hwdDecodeBool128(pvVar1);
        if (RVar39 != 0) {
          RVar39 = vp8hwdReadBits(pvVar1,6);
          p->mbModeLfDelta[lVar38] = RVar39;
          RVar39 = vp8hwdDecodeBool128(pvVar1);
          if (RVar39 != 0) {
            p->mbModeLfDelta[lVar38] = -p->mbModeLfDelta[lVar38];
          }
        }
        lVar38 = lVar38 + 1;
      } while (lVar38 != 4);
    }
    if ((p->bitstr).strmError != 0) {
      _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
      uVar43 = 0x38a;
      goto LAB_001b03f6;
    }
    RVar39 = vp8hwdReadBits(pvVar1,2);
    p->nbrDctPartitions = RVar39;
    RVar39 = vp8hwdReadBits(pvVar1,7);
    p->qpYAc = (RK_S8)RVar39;
    RVar25 = DecodeQuantizerDelta(pvVar1);
    p->qpYDc = (RK_S8)RVar25;
    RVar25 = DecodeQuantizerDelta(pvVar1);
    p->qpY2Dc = (RK_S8)RVar25;
    RVar25 = DecodeQuantizerDelta(pvVar1);
    p->qpY2Ac = (RK_S8)RVar25;
    RVar25 = DecodeQuantizerDelta(pvVar1);
    p->qpChDc = (RK_S8)RVar25;
    RVar25 = DecodeQuantizerDelta(pvVar1);
    p->qpChAc = (RK_S8)RVar25;
    if (p->keyFrame == 0) {
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refreshGolden = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refreshAlternate = RVar39;
      RVar26 = 0;
      RVar23 = 0;
      if (p->refreshGolden == 0) {
        RVar23 = vp8hwdReadBits(pvVar1,2);
        RVar39 = p->refreshAlternate;
      }
      p->copyBufferToGolden = RVar23;
      if (RVar39 == 0) {
        RVar26 = vp8hwdReadBits(pvVar1,2);
      }
      p->copyBufferToAlternate = RVar26;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refFrameSignBias[0] = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refFrameSignBias[1] = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refreshEntropyProbs = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refreshLast = RVar39;
      RVar39 = p->refreshEntropyProbs;
    }
    else {
      p->refreshGolden = 1;
      p->refreshAlternate = 1;
      p->copyBufferToGolden = 0;
      p->copyBufferToAlternate = 0;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refreshEntropyProbs = RVar39;
      p->refFrameSignBias[0] = 0;
      p->refFrameSignBias[1] = 0;
      p->refreshLast = 1;
    }
    if (RVar39 == 0) {
      memcpy(&p->entropyLast,&p->entropy,0x44d);
      uVar44 = *(undefined8 *)(p->vp7ScanOrder + 2);
      uVar12 = *(undefined8 *)(p->vp7ScanOrder + 4);
      uVar13 = *(undefined8 *)(p->vp7ScanOrder + 6);
      uVar14 = *(undefined8 *)(p->vp7ScanOrder + 8);
      uVar15 = *(undefined8 *)(p->vp7ScanOrder + 10);
      uVar16 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
      uVar17 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
      *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
      *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar44;
      *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar12;
      *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar13;
      *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar14;
      *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar15;
      *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar16;
      *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar17;
    }
    vp8hwdDecodeCoeffUpdate(p);
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->coeffSkipMode = (RK_U8)RVar39;
    if (p->keyFrame == 0) {
      if (RVar39 != 0) {
        RVar39 = vp8hwdReadBits(pvVar1,8);
        p->probMbSkipFalse = RVar39;
      }
      RVar39 = vp8hwdReadBits(pvVar1,8);
      p->probIntra = RVar39;
      RVar39 = vp8hwdReadBits(pvVar1,8);
      p->probRefLast = RVar39;
      RVar39 = vp8hwdReadBits(pvVar1,8);
      p->probRefGolden = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      if (RVar39 != 0) {
        lVar38 = 0;
        do {
          RVar39 = vp8hwdReadBits(pvVar1,8);
          (p->entropy).probLuma16x16PredMode[lVar38] = (RK_U8)RVar39;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 4);
      }
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      if (RVar39 != 0) {
        lVar38 = -3;
        do {
          RVar39 = vp8hwdReadBits(pvVar1,8);
          (p->entropy).probMvContext[0][lVar38] = (RK_U8)RVar39;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 0);
      }
      lVar38 = 0;
      bVar50 = true;
      do {
        bVar32 = bVar50;
        lVar40 = 0;
        do {
          RVar39 = vp8hwdDecodeBool(pvVar1,(uint)MvUpdateProbs[lVar38][lVar40]);
          if (RVar39 != 0) {
            RVar39 = vp8hwdReadBits(pvVar1,7);
            RVar21 = (char)RVar39 * '\x02';
            if (RVar39 == 0) {
              RVar21 = '\x01';
            }
            (p->entropy).probMvContext[lVar38][lVar40] = RVar21;
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0x13);
        lVar38 = 1;
        bVar50 = false;
      } while (bVar32);
    }
    else if (RVar39 != 0) {
      RVar39 = vp8hwdReadBits(pvVar1,8);
      p->probMbSkipFalse = RVar39;
    }
    if ((p->bitstr).strmError != 0) {
      _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
      uVar43 = 999;
      goto LAB_001b03f6;
    }
    if ((vp8d_debug & 1) != 0) {
      MVar28 = MPP_OK;
      uVar43 = 0x3ea;
      goto LAB_001b0405;
    }
    pRVar48 = p->bitstream_sw_buf;
    goto LAB_001b04ee;
  }
  if (p->needKeyFrame != 0) goto LAB_001af51e;
  _mpp_log_l(2,"vp8d_parser","no found key frame",(char *)0x0);
  MVar28 = MPP_NOK;
  goto LAB_001b0438;
code_r0x001afa5c:
  lVar38 = lVar38 + 1;
  if ((int)lVar38 == 4) goto code_r0x001afa65;
  goto LAB_001afa50;
code_r0x001afa65:
  p->nbrDctPartitions = 0;
  RVar39 = vp8hwdReadBits(pvVar1,7);
  p->qpYAc = (RK_S8)RVar39;
  RVar39 = vp8hwdReadBits(pvVar1,1);
  if (RVar39 == 0) {
    RVar20 = p->qpYAc;
  }
  else {
    RVar39 = vp8hwdReadBits(pvVar1,7);
    RVar20 = (RK_S8)RVar39;
  }
  p->qpYDc = RVar20;
  RVar39 = vp8hwdReadBits(pvVar1,1);
  if (RVar39 == 0) {
    RVar20 = p->qpYAc;
  }
  else {
    RVar39 = vp8hwdReadBits(pvVar1,7);
    RVar20 = (RK_S8)RVar39;
  }
  p->qpY2Dc = RVar20;
  RVar39 = vp8hwdReadBits(pvVar1,1);
  if (RVar39 == 0) {
    RVar20 = p->qpYAc;
  }
  else {
    RVar39 = vp8hwdReadBits(pvVar1,7);
    RVar20 = (RK_S8)RVar39;
  }
  p->qpY2Ac = RVar20;
  RVar39 = vp8hwdReadBits(pvVar1,1);
  if (RVar39 == 0) {
    RVar20 = p->qpYAc;
  }
  else {
    RVar39 = vp8hwdReadBits(pvVar1,7);
    RVar20 = (RK_S8)RVar39;
  }
  p->qpChDc = RVar20;
  RVar39 = vp8hwdReadBits(pvVar1,1);
  if (RVar39 == 0) {
    RVar20 = p->qpYAc;
  }
  else {
    RVar39 = vp8hwdReadBits(pvVar1,7);
    RVar20 = (RK_S8)RVar39;
  }
  p->qpChAc = RVar20;
  if (p->keyFrame == 0) {
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->refreshGolden = RVar39;
    if (p->vpVersion == '\0') goto LAB_001aff0d;
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->refreshEntropyProbs = RVar39;
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    p->refreshLast = RVar39;
    if (p->refreshEntropyProbs == 0) {
      memcpy(&p->entropyLast,&p->entropy,0x44d);
      uVar44 = *(undefined8 *)(p->vp7ScanOrder + 2);
      uVar12 = *(undefined8 *)(p->vp7ScanOrder + 4);
      uVar13 = *(undefined8 *)(p->vp7ScanOrder + 6);
      uVar14 = *(undefined8 *)(p->vp7ScanOrder + 8);
      uVar15 = *(undefined8 *)(p->vp7ScanOrder + 10);
      uVar16 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
      uVar17 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
      *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
      *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar44;
      *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar12;
      *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar13;
      *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar14;
      *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar15;
      *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar16;
      *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar17;
    }
    if (RVar39 != 0) goto LAB_001aff14;
LAB_001aff58:
    if (p->vpVersion == '\0') {
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->loopFilterType = RVar39;
    }
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    if (RVar39 != 0) {
      p->vp7ScanOrder[0] = 0;
      lVar38 = 0;
      do {
        RVar39 = vp8hwdReadBits(pvVar1,4);
        p->vp7ScanOrder[lVar38 + 1] =
             *(RK_U32 *)(vp7_header_parser_Vp7DefaultScan + (ulong)RVar39 * 4);
        lVar38 = lVar38 + 1;
      } while (lVar38 != 0xf);
    }
    if (p->vpVersion != '\0') {
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->loopFilterType = RVar39;
    }
    RVar39 = vp8hwdReadBits(pvVar1,6);
    p->loopFilterLevel = RVar39;
    RVar39 = vp8hwdReadBits(pvVar1,3);
    p->loopFilterSharpness = RVar39;
    vp8hwdDecodeCoeffUpdate(p);
    if (p->keyFrame == 0) {
      RVar39 = vp8hwdReadBits(pvVar1,8);
      p->probIntra = RVar39;
      RVar39 = vp8hwdReadBits(pvVar1,8);
      p->probRefLast = RVar39;
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      if (RVar39 != 0) {
        lVar38 = 0;
        do {
          RVar39 = vp8hwdReadBits(pvVar1,8);
          (p->entropy).probLuma16x16PredMode[lVar38] = (RK_U8)RVar39;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 4);
      }
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      if (RVar39 != 0) {
        lVar38 = -3;
        do {
          RVar39 = vp8hwdReadBits(pvVar1,8);
          (p->entropy).probMvContext[0][lVar38] = (RK_U8)RVar39;
          lVar38 = lVar38 + 1;
        } while (lVar38 != 0);
      }
      lVar38 = 0;
      bVar50 = true;
      do {
        bVar32 = bVar50;
        lVar40 = 0;
        do {
          RVar39 = vp8hwdDecodeBool(pvVar1,(uint)MvUpdateProbs[lVar38][lVar40]);
          if (RVar39 != 0) {
            RVar39 = vp8hwdReadBits(pvVar1,7);
            RVar21 = (char)RVar39 * '\x02';
            if (RVar39 == 0) {
              RVar21 = '\x01';
            }
            (p->entropy).probMvContext[lVar38][lVar40] = RVar21;
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 != 0x11);
        lVar38 = 1;
        bVar50 = false;
      } while (bVar32);
    }
    bVar50 = (p->bitstr).strmError == 0;
    MVar28 = MPP_ERR_PROTOL;
    if (bVar50) {
      MVar28 = MPP_OK;
    }
    if ((vp8d_debug & 1) != 0) {
      uVar43 = (ulong)((uint)bVar50 * 4 + 0x477);
      goto LAB_001b013d;
    }
  }
  else {
    p->refreshGolden = 1;
    p->refreshAlternate = 1;
    p->copyBufferToGolden = 0;
    p->copyBufferToAlternate = 0;
    if (p->vpVersion == '\0') {
      p->refFrameSignBias[0] = 0;
      p->refFrameSignBias[1] = 0;
LAB_001aff0d:
      p->refreshLast = 1;
      p->refreshEntropyProbs = 1;
    }
    else {
      RVar39 = vp8hwdDecodeBool128(pvVar1);
      p->refreshEntropyProbs = RVar39;
      p->refFrameSignBias[0] = 0;
      p->refFrameSignBias[1] = 0;
      p->refreshLast = 1;
      if (RVar39 == 0) {
        memcpy(&p->entropyLast,&p->entropy,0x44d);
        uVar44 = *(undefined8 *)(p->vp7ScanOrder + 2);
        uVar12 = *(undefined8 *)(p->vp7ScanOrder + 4);
        uVar13 = *(undefined8 *)(p->vp7ScanOrder + 6);
        uVar14 = *(undefined8 *)(p->vp7ScanOrder + 8);
        uVar15 = *(undefined8 *)(p->vp7ScanOrder + 10);
        uVar16 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
        uVar17 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
        *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
        *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar44;
        *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar12;
        *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar13;
        *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar14;
        *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar15;
        *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar16;
        *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar17;
      }
    }
LAB_001aff14:
    RVar39 = vp8hwdDecodeBool128(pvVar1);
    if (RVar39 == 0) goto LAB_001aff58;
    vp8hwdReadBits(pvVar1,8);
    vp8hwdReadBits(pvVar1,8);
    uVar43 = 0x448;
    MVar28 = MPP_ERR_STREAM;
LAB_001aff46:
    if ((vp8d_debug & 1) == 0) goto LAB_001b0438;
LAB_001b013d:
    pcVar29 = "vp7_header_parser";
LAB_001b040c:
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar43,pcVar29);
  }
  if (MVar28 == MPP_OK) {
    pRVar48 = p->bitstream_sw_buf;
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x487,
                 "vp8hwdSetPartitionOffsets");
    }
LAB_001b04ee:
    iVar36 = 0;
    iVar37 = 0;
    if ((p->decMode == 2) && (iVar37 = 7, p->keyFrame == 0)) {
      iVar37 = 0;
    }
    bVar33 = (byte)p->nbrDctPartitions;
    iVar27 = (3 << (bVar33 & 0x1f)) + p->frameTagSize + p->offsetToDctParts + -3;
    if (p->nbrDctPartitions == 0) {
      uVar43 = 0;
    }
    else {
      uVar49 = -1 << (bVar33 & 0x1f);
      puVar41 = (uint3 *)(pRVar48 + (ulong)(p->offsetToDctParts + iVar37) + (ulong)p->frameTagSize);
      uVar22 = 0xfffffffe;
      if (uVar49 < 0xfffffffe) {
        uVar22 = uVar49;
      }
      uVar43 = (ulong)~uVar22;
      uVar42 = 0;
      iVar36 = 0;
      do {
        p->dctPartitionOffsets[uVar42] = iVar36 + iVar27;
        iVar36 = (uint)*puVar41 + iVar36;
        puVar41 = (uint3 *)((long)puVar41 + 3);
        uVar42 = uVar42 + 1;
      } while (uVar43 != uVar42);
    }
    p->dctPartitionOffsets[uVar43] = iVar36 + iVar27;
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x25f,
                 "vp8d_alloc_frame");
    }
    pVVar30 = p->frame_out;
    if (pVVar30 == (VP8Frame *)0x0) {
      pVVar30 = (VP8Frame *)mpp_osal_calloc("vp8d_alloc_frame",0x10);
      p->frame_out = pVVar30;
      MVar28 = MPP_ERR_NOMEM;
      if (pVVar30 != (VP8Frame *)0x0) {
        s = pVVar30->f;
        if (s == (MppFrame)0x0) {
          mpp_frame_init((MppFrame *)pVVar30);
          pVVar30 = p->frame_out;
          s = pVVar30->f;
          if (s == (MppFrame)0x0) {
            pcVar29 = "alloc vp8 mpp frame fail";
            goto LAB_001b0d3d;
          }
        }
        pVVar30->slot_index = 0xff;
        pVVar30->invisible = p->showFrame == 0;
        goto LAB_001b0650;
      }
      pcVar29 = "alloc vp8 frame fail";
LAB_001b0d3d:
      _mpp_log_l(2,"vp8d_parser",pcVar29,(char *)0x0);
      _mpp_log_l(2,"vp8d_parser","vp8d_alloc_frame err ret %d",(char *)0x0,(ulong)(uint)MVar28);
      uVar44 = 0x517;
      goto LAB_001b045d;
    }
    if (pVVar30->slot_index == 0xff) {
      s = pVVar30->f;
LAB_001b0650:
      mpp_frame_set_width(s,p->width);
      mpp_frame_set_height(p->frame_out->f,p->height);
      mpp_frame_set_hor_stride(p->frame_out->f,p->width);
      mpp_frame_set_ver_stride(p->frame_out->f,p->height);
      mpp_frame_set_errinfo(p->frame_out->f,0);
      mpp_frame_set_pts(p->frame_out->f,p->pts);
      MVar28 = mpp_buf_slot_get_unused(p->frame_slots,&p->frame_out->slot_index);
      if (MVar28 != MPP_OK) {
        pcVar29 = "vp8 buf_slot_get_unused get fail";
        goto LAB_001b0d3d;
      }
      mpp_buf_slot_set_prop(p->frame_slots,p->frame_out->slot_index,SLOT_FRAME,p->frame_out->f);
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_CODEC_USE);
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_HAL_OUTPUT);
      mpp_frame_set_mode(p->frame_out->f,0);
      if (p->showFrame != 0) {
        mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(p->frame_slots,p->frame_out->slot_index,QUEUE_DISPLAY);
      }
      pRVar2 = &p->frame_out->ref_count;
      *pRVar2 = *pRVar2 + '\x01';
    }
    if ((vp8d_debug & 1) == 0) {
      pDVar46 = p->dxva_ctx;
    }
    else {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x290,
                 "vp8d_alloc_frame");
      pDVar46 = p->dxva_ctx;
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x1ed,
                   "vp8d_convert_to_syntx");
      }
    }
    uVar22 = (p->bitstr).pos * 8 - (p->bitstr).count;
    bVar50 = p->keyFrame == 0;
    iVar37 = 0x38;
    if (bVar50) {
      iVar37 = 0;
    }
    iVar36 = 0;
    if (p->decMode == 2) {
      iVar36 = iVar37;
    }
    uVar49 = uVar22 + (uint)(p->frameTagSize == 4) * 8 + iVar36 + 8;
    pDVar46->stream_start_offset = uVar49 >> 3 & 0xfffffff8;
    pDVar46->stream_start_bit = uVar22 & 7 | uVar49 & 0x38;
    bVar33 = (pDVar46->field_4).wFrameTagFlags;
    bVar31 = (pDVar46->stVP8Segments).field_0.wSegmentFlags;
    (pDVar46->field_4).wFrameTagFlags = bVar33 & 0xfe | bVar50;
    bVar34 = (byte)p->segmentationEnabled & 1;
    (pDVar46->stVP8Segments).field_0.wSegmentFlags = bVar31 & 0xfe | bVar34;
    bVar35 = (char)p->segmentationMapUpdate * '\x02' & 2;
    (pDVar46->stVP8Segments).field_0.wSegmentFlags = bVar31 & 0xfc | bVar34 | bVar35;
    pDVar46->mode_ref_lf_delta_enabled = (RK_U8)p->modeRefLfEnabled;
    pDVar46->mb_no_coeff_skip = p->coeffSkipMode;
    RVar39 = p->height;
    pDVar46->width = p->width;
    pDVar46->height = RVar39;
    pDVar46->decMode = p->decMode;
    pDVar46->filter_type = (RK_U8)p->loopFilterType;
    pDVar46->sharpness = (RK_U8)p->loopFilterSharpness;
    pDVar46->filter_level = (RK_U8)p->loopFilterLevel;
    (pDVar46->stVP8Segments).field_0.wSegmentFlags =
         bVar31 & 0xf8 | bVar34 | bVar35 | ((byte)p->segmentFeatureMode & 1) << 2;
    (pDVar46->field_4).wFrameTagFlags = bVar33 & 0xf0 | bVar50 | p->vpVersion * '\x02' & 0xe;
    pDVar46->bool_value = (uint)*(byte *)((long)&(p->bitstr).value + 3);
    pDVar46->bool_range = (uint)(byte)(p->bitstr).range;
    pDVar46->frameTagSize = p->frameTagSize;
    pDVar46->streamEndPos = (p->bitstr).streamEndPos;
    pDVar46->log2_nbr_of_dct_partitions = (RK_U8)p->nbrDctPartitions;
    pDVar46->offsetToDctParts = p->offsetToDctParts;
    uVar43._0_1_ = p->qpYAc;
    uVar43._1_1_ = p->qpYDc;
    uVar4 = p->qpY2Ac;
    uVar5 = p->qpY2Dc;
    uVar7 = p->qpChAc;
    uVar9 = p->qpChDc;
    uVar11 = *(undefined2 *)&p->field_0xf6;
    uVar10 = CONCAT21(uVar11,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    uVar6 = CONCAT41(uVar8,uVar5);
    uVar43._2_6_ = CONCAT51(uVar6,uVar4);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar43;
    auVar51 = psllw(auVar51,8);
    uVar22 = auVar51._0_4_ | CONCAT22((ushort)uVar43._2_6_ >> 8,(ushort)uVar43 >> 8);
    pDVar46->y1dc_delta_q = (char)uVar22;
    pDVar46->y1ac_delta_q = (char)(uVar22 >> 8);
    pDVar46->y2dc_delta_q = (char)(uVar22 >> 0x10);
    pDVar46->y2ac_delta_q = (char)(uVar22 >> 0x18);
    pDVar46->uvac_delta_q = p->qpChAc;
    pDVar46->uvdc_delta_q = p->qpChDc;
    pDVar46->probe_skip_false = (RK_U8)p->probMbSkipFalse;
    pDVar46->prob_intra = (RK_U8)p->probIntra;
    pDVar46->prob_last = (RK_U8)p->probRefLast;
    pDVar46->prob_golden = (RK_U8)p->probRefGolden;
    memcpy(pDVar46->vp8_coef_update_probs,(p->entropy).probCoeffs,0x420);
    uVar44 = *(undefined8 *)((p->entropy).probMvContext[0] + 8);
    uVar12 = *(undefined8 *)((p->entropy).probMvContext[0] + 0x10);
    uVar13 = *(undefined8 *)((p->entropy).probMvContext[1] + 5);
    *(undefined8 *)pDVar46->vp8_mv_update_probs[0] = *(undefined8 *)(p->entropy).probMvContext[0];
    *(undefined8 *)(pDVar46->vp8_mv_update_probs[0] + 8) = uVar44;
    *(undefined8 *)(pDVar46->vp8_mv_update_probs[0] + 0x10) = uVar12;
    *(undefined8 *)(pDVar46->vp8_mv_update_probs[1] + 5) = uVar13;
    *(undefined8 *)(pDVar46->vp8_mv_update_probs[1] + 0xb) =
         *(undefined8 *)((p->entropy).probMvContext[1] + 0xb);
    lVar38 = -3;
    do {
      pDVar46->vp8_mv_update_probs[0][lVar38] = (p->entropy).probMvContext[0][lVar38];
      pDVar46->ref_lf_deltas[lVar38 + -5] = (p->entropy).probLuma16x16PredMode[lVar38 * 4];
      lVar38 = lVar38 + 1;
    } while (lVar38 != 0);
    pDVar46->ref_frame_sign_bias_golden = (RK_U8)p->refFrameSignBias[0];
    pDVar46->ref_frame_sign_bias_altref = (RK_U8)p->refFrameSignBias[1];
    lVar38 = 0;
    do {
      (pDVar46->stVP8Segments).segment_feature_data[0][lVar38] = (RK_S8)p->segmentQp[lVar38];
      pDVar46->ref_lf_deltas[lVar38] = (RK_S8)p->mbRefLfDelta[lVar38];
      pDVar46->mode_lf_deltas[lVar38] = (RK_S8)p->mbModeLfDelta[lVar38];
      (pDVar46->stVP8Segments).segment_feature_data[1][lVar38] = (RK_S8)p->segmentLoopfilter[lVar38]
      ;
      pDVar46->intra_16x16_prob[lVar38] = (p->entropy).probLuma16x16PredMode[lVar38];
      lVar38 = lVar38 + 1;
    } while (lVar38 != 4);
    (p->dxva_ctx->CurrPic).field_0.bPicEntry =
         (p->dxva_ctx->CurrPic).field_0.bPicEntry & 0x80 | (byte)p->frame_out->slot_index & 0x7f;
    in_task->refer[0xc] = -1;
    in_task->refer[0xd] = -1;
    in_task->refer[0xe] = -1;
    in_task->refer[0xf] = -1;
    in_task->refer[8] = -1;
    in_task->refer[9] = -1;
    in_task->refer[10] = -1;
    in_task->refer[0xb] = -1;
    in_task->refer[4] = -1;
    in_task->refer[5] = -1;
    in_task->refer[6] = -1;
    in_task->refer[7] = -1;
    in_task->refer[0] = -1;
    in_task->refer[1] = -1;
    in_task->refer[2] = -1;
    in_task->refer[3] = -1;
    in_task->refer[0x10] = -1;
    if (p->frame_ref == (VP8Frame *)0x0) {
      (pDVar46->lst_fb_idx).field_0.bPicEntry = (pDVar46->lst_fb_idx).field_0.bPicEntry | 0x7f;
    }
    else {
      (pDVar46->lst_fb_idx).field_0.bPicEntry =
           (pDVar46->lst_fb_idx).field_0.bPicEntry & 0x80 | (byte)p->frame_ref->slot_index & 0x7f;
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_ref->slot_index,SLOT_HAL_INPUT);
      in_task->refer[0] = p->frame_ref->slot_index;
    }
    if (p->frame_golden == (VP8Frame *)0x0) {
      (pDVar46->gld_fb_idx).field_0.bPicEntry = (pDVar46->gld_fb_idx).field_0.bPicEntry | 0x7f;
    }
    else {
      (pDVar46->gld_fb_idx).field_0.bPicEntry =
           (pDVar46->gld_fb_idx).field_0.bPicEntry & 0x80 | (byte)p->frame_golden->slot_index & 0x7f
      ;
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_golden->slot_index,SLOT_HAL_INPUT);
      in_task->refer[1] = p->frame_golden->slot_index;
    }
    if (p->frame_alternate == (VP8Frame *)0x0) {
      (pDVar46->alt_fb_idx).field_0.bPicEntry = (pDVar46->alt_fb_idx).field_0.bPicEntry | 0x7f;
    }
    else {
      (pDVar46->alt_fb_idx).field_0.bPicEntry =
           (pDVar46->alt_fb_idx).field_0.bPicEntry & 0x80 |
           (byte)p->frame_alternate->slot_index & 0x7f;
      mpp_buf_slot_set_flag(p->frame_slots,p->frame_alternate->slot_index,SLOT_HAL_INPUT);
      in_task->refer[2] = p->frame_alternate->slot_index;
    }
    uVar44 = *(undefined8 *)p->dctPartitionOffsets;
    uVar12 = *(undefined8 *)(p->dctPartitionOffsets + 2);
    uVar13 = *(undefined8 *)(p->dctPartitionOffsets + 6);
    *(undefined8 *)(pDVar46->dctPartitionOffsets + 4) = *(undefined8 *)(p->dctPartitionOffsets + 4);
    *(undefined8 *)(pDVar46->dctPartitionOffsets + 6) = uVar13;
    *(undefined8 *)pDVar46->dctPartitionOffsets = uVar44;
    *(undefined8 *)(pDVar46->dctPartitionOffsets + 2) = uVar12;
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",599,
                 "vp8d_convert_to_syntx");
    }
    if (p->refreshEntropyProbs == 0) {
      memcpy(&p->entropy,&p->entropyLast,0x44d);
      uVar44 = *(undefined8 *)(p->vp7PrevScanOrder + 2);
      uVar12 = *(undefined8 *)(p->vp7PrevScanOrder + 4);
      uVar13 = *(undefined8 *)(p->vp7PrevScanOrder + 6);
      uVar14 = *(undefined8 *)(p->vp7PrevScanOrder + 8);
      uVar15 = *(undefined8 *)(p->vp7PrevScanOrder + 10);
      uVar16 = *(undefined8 *)(p->vp7PrevScanOrder + 0xc);
      uVar17 = *(undefined8 *)(p->vp7PrevScanOrder + 0xe);
      *(undefined8 *)p->vp7ScanOrder = *(undefined8 *)p->vp7PrevScanOrder;
      *(undefined8 *)(p->vp7ScanOrder + 2) = uVar44;
      *(undefined8 *)(p->vp7ScanOrder + 4) = uVar12;
      *(undefined8 *)(p->vp7ScanOrder + 6) = uVar13;
      *(undefined8 *)(p->vp7ScanOrder + 8) = uVar14;
      *(undefined8 *)(p->vp7ScanOrder + 10) = uVar15;
      *(undefined8 *)(p->vp7ScanOrder + 0xc) = uVar16;
      *(undefined8 *)(p->vp7ScanOrder + 0xe) = uVar17;
    }
    (in_task->syntax).data = p->dxva_ctx;
    (in_task->syntax).number = 1;
    in_task->output = p->frame_out->slot_index;
    in_task->valid = 1;
    if (p->eos != 0) {
      (in_task->flags).val = (in_task->flags).val & 0xfffffffffffffffe | (ulong)(p->eos & 1);
    }
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x2a5,
                 "vp8d_ref_update");
    }
    if (p->decMode != 3) {
      if (p->copyBufferToAlternate == 2) {
        pVVar30 = p->frame_alternate;
        lVar38 = 0x28;
LAB_001b0d84:
        if (pVVar30 != (VP8Frame *)0x0) {
          vp8d_unref_frame(p,pVVar30);
        }
        pVVar30 = *(VP8Frame **)((long)&p->dxva_ctx + lVar38);
        p->frame_alternate = pVVar30;
        vp8d_ref_frame(pVVar30);
      }
      else if (p->copyBufferToAlternate == 1) {
        pVVar30 = p->frame_alternate;
        lVar38 = 0x20;
        goto LAB_001b0d84;
      }
      if (p->copyBufferToGolden == 2) {
        pVVar30 = p->frame_golden;
        lVar38 = 0x30;
LAB_001b0dc3:
        if (pVVar30 != (VP8Frame *)0x0) {
          vp8d_unref_frame(p,pVVar30);
        }
        pVVar30 = *(VP8Frame **)((long)&p->dxva_ctx + lVar38);
        p->frame_golden = pVVar30;
        vp8d_ref_frame(pVVar30);
      }
      else if (p->copyBufferToGolden == 1) {
        pVVar30 = p->frame_golden;
        lVar38 = 0x20;
        goto LAB_001b0dc3;
      }
      if (p->refreshGolden != 0) {
        if (p->frame_golden != (VP8Frame *)0x0) {
          vp8d_unref_frame(p,p->frame_golden);
        }
        p->frame_golden = p->frame_out;
        vp8d_ref_frame(p->frame_out);
      }
      if (p->refreshAlternate != 0) {
        if (p->frame_alternate != (VP8Frame *)0x0) {
          vp8d_unref_frame(p,p->frame_alternate);
        }
        p->frame_alternate = p->frame_out;
        vp8d_ref_frame(p->frame_out);
      }
      if (p->refreshLast != 0) {
        if (p->frame_ref != (VP8Frame *)0x0) {
          vp8d_unref_frame(p,p->frame_ref);
        }
        p->frame_ref = p->frame_out;
        vp8d_ref_frame(p->frame_out);
      }
      vp8d_unref_frame(p,p->frame_out);
      p->frame_out = (VP8Frame *)0x0;
    }
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x2e5,
                 "vp8d_ref_update");
    }
    if ((vp8d_debug >> 0xc & 1) != 0) {
      __s = (FILE *)p->stream_fp;
      if (__s == (FILE *)0x0) {
        uVar22 = getpid();
        sprintf(&local_138,"/data/video/mpp_dec_vp8_%d.bin",(ulong)uVar22);
        __s = fopen(&local_138,"wb");
        p->stream_fp = (FILE *)__s;
        if (__s == (FILE *)0x0) goto LAB_001b0fa8;
      }
      if (p->ivf_header_flag == 0) {
        write_ivf_header((VP8DParserContext_t *)(ulong)p->width,(FILE *)(ulong)p->height);
        p->ivf_header_flag = 1;
        __s = (FILE *)p->stream_fp;
      }
      RVar39 = p->stream_size;
      RVar23 = p->frame_cnt;
      local_138 = (char)RVar39;
      local_137 = (undefined1)(RVar39 >> 8);
      local_136 = (undefined1)(RVar39 >> 0x10);
      local_135 = (undefined1)(RVar39 >> 0x18);
      local_134 = (undefined1)RVar23;
      local_133 = (undefined1)(RVar23 >> 8);
      local_132 = (undefined1)(RVar23 >> 0x10);
      local_131 = (undefined1)(RVar23 >> 0x18);
      local_130 = 0;
      fwrite(&local_138,0xc,1,__s);
      fwrite(p->bitstream_sw_buf,1,(ulong)p->stream_size,(FILE *)p->stream_fp);
      fflush((FILE *)p->stream_fp);
    }
LAB_001b0fa8:
    p->frame_cnt = p->frame_cnt + 1;
    uVar44 = 0x53f;
    MVar28 = MPP_OK;
    goto LAB_001b045d;
  }
LAB_001b0438:
  _mpp_log_l(2,"vp8d_parser","decoder_frame_header err ret %d",(char *)0x0,(ulong)(uint)MVar28);
  uVar44 = 0x50e;
LAB_001b045d:
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar44,
               "vp8d_parser_parse");
  }
  return MVar28;
}

Assistant:

MPP_RET vp8d_parser_parse(void *ctx, HalDecTask *in_task)
{
    MPP_RET ret = MPP_OK;
    VP8DContext *c = (VP8DContext *)ctx;
    VP8DParserContext_t *p = (VP8DParserContext_t *)c->parse_ctx;
    FUN_T("FUN_IN");

    ret = decoder_frame_header(p, p->bitstream_sw_buf, p->stream_size);

    if (MPP_OK != ret) {
        mpp_err("decoder_frame_header err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8hwdSetPartitionOffsets(p, p->bitstream_sw_buf, p->stream_size);

    ret = vp8d_alloc_frame(p);
    if (MPP_OK != ret) {
        mpp_err("vp8d_alloc_frame err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8d_convert_to_syntx(p, in_task);
    /* Rollback entropy probabilities if refresh is not set */
    if (p->refreshEntropyProbs == 0) {
        memcpy((void*)&p->entropy, (void*)&p->entropyLast,
               (unsigned long)sizeof(vp8EntropyProbs_t));
        memcpy((void*)p->vp7ScanOrder, (void*)p->vp7PrevScanOrder,
               (unsigned long)sizeof(p->vp7ScanOrder));
    }
    in_task->syntax.data = (void *)p->dxva_ctx;
    in_task->syntax.number = 1;
    in_task->output = p->frame_out->slot_index;
    in_task->valid = 1;
    if (p->eos) {
        in_task->flags.eos = p->eos;
    }
    vp8d_ref_update(p);

    if (vp8d_debug & VP8D_DBG_DUMP_STREAM) {
        if (!p->stream_fp) {
            char name[256];

            sprintf(name, "/data/video/mpp_dec_vp8_%d.bin", getpid());
            p->stream_fp = fopen(name, "wb");
        }
        if (p->stream_fp) {
            if (!p->ivf_header_flag) {
                write_ivf_header(p, p->stream_fp);
                p->ivf_header_flag = 1;
            }
            write_ivf_frame(p->stream_fp, p->stream_size, p->frame_cnt);
            fwrite(p->bitstream_sw_buf, 1, p->stream_size, p->stream_fp);
            fflush(p->stream_fp);
        }
    }
    p->frame_cnt++;

    FUN_T("FUN_OUT");
    return ret;
}